

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::BuildEnumValue(google::protobuf::EnumValueDescriptorProto_const&,google::protobuf::EnumDescriptor_const*,google::protobuf::EnumValueDescriptor*,google::protobuf::internal::FlatAllocator&)::__0,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces;
  undefined8 local_78;
  char *local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  char *local_50;
  size_type local_48;
  undefined8 local_40;
  undefined8 local_38;
  char *local_30;
  ulong local_28;
  long local_20;
  undefined8 local_18;
  char *local_10;
  
  local_60 = **(undefined8 **)(**(long **)this + 8);
  local_68 = (*(undefined8 **)(**(long **)this + 8))[1];
  local_40 = **(undefined8 **)(this + 8);
  local_48 = (*(undefined8 **)(this + 8))[1];
  local_28 = (ulong)**(ushort **)(**(long **)(this + 0x10) + 8);
  local_78 = 0x83;
  local_70 = 
  "Note that enum values use C++ scoping rules, meaning that enum values are siblings of their type, not children of it.  Therefore, \""
  ;
  local_58 = 0x18;
  local_50 = "\" must be unique within ";
  local_38 = 0x13;
  local_30 = ", not just within \"";
  local_20 = ~local_28 + (long)*(ushort **)(**(long **)(this + 0x10) + 8);
  local_18 = 2;
  local_10 = "\".";
  pieces._M_len = local_48;
  pieces._M_array = (iterator)0x7;
  strings_internal::CatPieces_abi_cxx11_
            (__return_storage_ptr__,(strings_internal *)&local_78,pieces);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}